

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_GetGrevilleAbcissae(int order,int cv_count,double *knot,bool bPeriodic,double *g)

{
  double dVar1;
  double dVar2;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int i_2;
  int i_1;
  double t0;
  int i;
  int g_count;
  double *g_local;
  double *pdStack_20;
  bool bPeriodic_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  if ((((order < 2) || (cv_count < order)) || (knot == (double *)0x0)) || (g == (double *)0x0)) {
    cv_count_local._3_1_ = false;
  }
  else {
    local_4c = cv_count;
    if (bPeriodic) {
      local_4c = (cv_count - order) + 1;
    }
    if (order == 2) {
      for (t0._0_4_ = 0; t0._0_4_ < local_4c; t0._0_4_ = t0._0_4_ + 1) {
        g[t0._0_4_] = knot[t0._0_4_];
      }
    }
    else {
      dVar1 = knot[order + -2];
      pdStack_20 = knot;
      if (bPeriodic) {
        for (local_44 = 0; local_44 < order + -1; local_44 = local_44 + 1) {
          dVar2 = ON_GrevilleAbcissa(order,knot + local_44);
          g[local_44] = dVar2;
          if (dVar1 <= g[local_44]) {
            if ((local_44 < 1) || (g[local_44] - dVar1 <= dVar1 - g[local_44 + -1])) {
              local_50 = local_44;
            }
            else {
              local_50 = local_44 + -1;
            }
            pdStack_20 = knot + local_50;
            break;
          }
        }
      }
      for (local_48 = 0; local_48 < local_4c; local_48 = local_48 + 1) {
        dVar2 = ON_GrevilleAbcissa(order,pdStack_20 + local_48);
        g[local_48] = dVar2;
      }
      if ((bPeriodic) && (*g < dVar1)) {
        *g = dVar1;
      }
    }
    cv_count_local._3_1_ = true;
  }
  return cv_count_local._3_1_;
}

Assistant:

bool ON_GetGrevilleAbcissae( // get Greville abcissa from knots
          int order,          // order (>=2)
          int cv_count,       // cv count (>=order)
          const double* knot, // knot[] array
          bool bPeriodic,
          double* g           // has length cv_count in non-periodic case
                              // and length cv_count-order+1 in periodic case
          )
{
  // Grevielle abscissae for a given knot vector
  if ( order < 2 || cv_count < order || !knot || !g )
    return false;
  
  const int g_count = (bPeriodic) ? cv_count-order+1 : cv_count;
  
  if (order == 2)
  {
    // g[i] = knot[i] in degree 1 case
    for (int i = 0; i < g_count; i++)
      g[i] = knot[i];
  }    
  else 
  {
    // g = (knot[i]+...+knot[i+degree-1])/degree
    const double t0 = knot[order-2];
    if (bPeriodic)
    {
      for (int i = 0; i < order - 1; ++i)
      {
        g[i] = ON_GrevilleAbcissa(order, knot + i);
        if (g[i] >= t0)
        {
          knot += ((i > 0 && (t0 - g[i - 1]) < (g[i] - t0)) ? (i - 1) : i);
          break;
        }
      }
    }
    for ( int i = 0; i < g_count; ++i)
      g[i] = ON_GrevilleAbcissa( order, knot+i );
    if (bPeriodic && g[0] < t0)
      g[0] = t0;
  }
  
  return true;
}